

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoardsuperblockheader.h
# Opt level: O2

void * __thiscall
Hoard::HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>::reapAlloc
          (HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap> *this)

{
  char *pcVar1;
  
  if (this->_reapableObjects != 0) {
    pcVar1 = this->_position;
    this->_position = pcVar1 + this->_objectSize;
    this->_reapableObjects = this->_reapableObjects - 1;
    this->_objectsFree = this->_objectsFree - 1;
    return pcVar1;
  }
  return (void *)0x0;
}

Assistant:

void * reapAlloc() {
      assert (isValid());
      assert (_position);
      // Reap mode.
      if (_reapableObjects > 0) {
	auto * ptr = _position;
	_position = ptr + _objectSize;
	_reapableObjects--;
	_objectsFree--;
	assert ((size_t) ptr % Alignment == 0);
	return ptr;
      } else {
	return nullptr;
      }
    }